

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_t __n;
  char *__s1;
  int iVar1;
  IepDeiMode IVar2;
  IepVideoMode IVar3;
  IepRgbEnhanceMode IVar4;
  IepRgbEnhanceOrder IVar5;
  IepColorConvertMode IVar6;
  RK_S32 RVar7;
  RK_S32 RVar8;
  RK_U32 RVar9;
  dictionary *ini;
  RK_U8 *__s;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  MppBuffer buffer;
  IepTestCfg cfg;
  pthread_t td;
  IepTestInfo info;
  
  if (argc < 2) {
    iep_test_help();
LAB_001037bf:
    iVar1 = 0;
  }
  else {
    memset(&cfg,0,0x188);
    memset(&info,0,0x88);
    cfg.src_fmt = 0x12;
    _opterr = 0;
    cfg.dst_fmt = cfg.src_fmt;
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      while( true ) {
                        while (iVar1 = getopt(argc,argv,"f:w:h:c:F:W:H:C:m:x:"), __s1 = _optarg,
                              iVar1 == 0x43) {
                          cfg.dst_fmt = str_to_iep_fmt(_optarg);
                        }
                        if (iVar1 != 0x46) break;
                        _mpp_log_l(4,"iep_test","output filename: %s\n",0,_optarg);
                        strncpy(cfg.dst_url,_optarg,99);
                        cfg.fp_dst = (FILE *)fopen(cfg.dst_url,"w+b");
                      }
                      if (iVar1 != 0x48) break;
                      cfg.dst_h = atoi(_optarg);
                    }
                    if (iVar1 != 0x57) break;
                    cfg.dst_w = atoi(_optarg);
                  }
                  if (iVar1 != 99) break;
                  cfg.src_fmt = str_to_iep_fmt(_optarg);
                }
                if (iVar1 != 0x66) break;
                _mpp_log_l(4,"iep_test","input filename: %s\n",0,_optarg);
                strncpy(cfg.src_url,_optarg,99);
                cfg.fp_src = (FILE *)fopen(cfg.src_url,"rb");
              }
              if (iVar1 != 0x68) break;
              cfg.src_h = atoi(_optarg);
            }
            if (iVar1 != 0x6d) break;
            iVar1 = strcmp(_optarg,"deinterlace");
            if (iVar1 == 0) {
              cfg.mode = TEST_CASE_DEINTERLACE;
            }
            else {
              iVar1 = strcmp(__s1,"yuvenhance");
              if (iVar1 == 0) {
                cfg.mode = TEST_CASE_YUVENHANCE;
              }
              else {
                iVar1 = strcmp(__s1,"rgbenhance");
                if (iVar1 == 0) {
                  cfg.mode = TEST_CASE_RGBENHANCE;
                }
                else {
                  _mpp_log_l(2,"iep_test","invalid work mode %s\n",0,__s1);
                  cfg.mode = TEST_CASE_NONE;
                }
              }
            }
          }
          if (iVar1 != 0x77) break;
          cfg.src_w = atoi(_optarg);
        }
        if (iVar1 != 0x78) break;
        _mpp_log_l(4,"iep_test","configure filename: %s\n",0,_optarg);
        strncpy(cfg.cfg_url,_optarg,99);
        ini = iniparser_load(cfg.cfg_url);
        cfg.ini = ini;
        if (ini == (dictionary *)0x0) {
          _mpp_log_l(2,"iep_test","invalid configure file %s\n",0,_optarg);
        }
        else {
          cfg.dei_cfg = (IepCmdParamDeiCfg *)mpp_osal_calloc("parse_cfg",0x20);
          iVar1 = iniparser_find_entry(ini,"deinterlace");
          if (iVar1 == 0) {
            (cfg.dei_cfg)->dei_high_freq_en = 1;
            (cfg.dei_cfg)->dei_mode = IEP_DEI_MODE_I4O1;
            (cfg.dei_cfg)->dei_field_order = IEP_DEI_FLD_ORDER_BOT_FIRST;
            (cfg.dei_cfg)->dei_ei_mode = 0;
            (cfg.dei_cfg)->dei_ei_smooth = 0;
            (cfg.dei_cfg)->dei_ei_sel = 0;
            (cfg.dei_cfg)->dei_ei_radius = 0;
          }
          else {
            if ((cfg.dei_cfg == (IepCmdParamDeiCfg *)0x0) &&
               (_mpp_log_l(2,"iep_test","Assertion %s failed at %s:%d\n",0,"cfg->dei_cfg",
                           "parse_cfg",0x5f), (DAT_0010d1a3 & 0x10) != 0)) goto LAB_0010436b;
            RVar9 = iniparser_getint(ini,"deinterlace:high_freq_en",0);
            (cfg.dei_cfg)->dei_high_freq_en = RVar9;
            IVar2 = iniparser_getint(ini,"deinterlace:dei_mode",0);
            (cfg.dei_cfg)->dei_mode = IVar2;
            RVar9 = iniparser_getint(ini,"deinterlace:dei_high_freq_fct",0);
            (cfg.dei_cfg)->dei_high_freq_fct = RVar9;
            RVar9 = iniparser_getint(ini,"deinterlace:dei_ei_mode",0);
            (cfg.dei_cfg)->dei_ei_mode = RVar9;
            RVar9 = iniparser_getint(ini,"deinterlace:dei_ei_smooth",0);
            (cfg.dei_cfg)->dei_ei_smooth = RVar9;
            RVar9 = iniparser_getint(ini,"deinterlace:dei_ei_sel",0);
            (cfg.dei_cfg)->dei_ei_sel = RVar9;
            RVar9 = iniparser_getint(ini,"deinterlace:dei_ei_radius",0);
            (cfg.dei_cfg)->dei_ei_radius = RVar9;
          }
          iVar1 = iniparser_find_entry(ini,"yuv enhance");
          if (iVar1 != 0) {
            cfg.yuv_enh = (IepCmdParamYuvEnhance *)mpp_osal_calloc("parse_cfg",0x18);
            iVar1 = iniparser_getint(ini,"yuv enhance:saturation",0);
            (cfg.yuv_enh)->saturation = (float)iVar1;
            iVar1 = iniparser_getint(ini,"yuv enhance:contrast",0);
            (cfg.yuv_enh)->contrast = (float)iVar1;
            iVar1 = iniparser_getint(ini,"yuv enhance:brightness",0);
            (cfg.yuv_enh)->brightness = (RK_S8)iVar1;
            iVar1 = iniparser_getint(ini,"yuv enhance:hue_angle",0);
            (cfg.yuv_enh)->hue_angle = (float)iVar1;
            IVar3 = iniparser_getint(ini,"yuv enhance:video_mode",0);
            (cfg.yuv_enh)->video_mode = IVar3;
            iVar1 = iniparser_getint(ini,"yuv enhance:color_bar_y",0);
            (cfg.yuv_enh)->color_bar_y = (RK_U8)iVar1;
            iVar1 = iniparser_getint(ini,"yuv enhance:color_bar_u",0);
            (cfg.yuv_enh)->color_bar_u = (RK_U8)iVar1;
            iVar1 = iniparser_getint(ini,"yuv enhance:color_bar_v",0);
            (cfg.yuv_enh)->color_bar_v = (RK_U8)iVar1;
          }
          iVar1 = iniparser_find_entry(ini,"rgb enhance");
          if (iVar1 != 0) {
            cfg.rgb_enh = (IepCmdParamRgbEnhance *)mpp_osal_calloc("parse_cfg",0x40);
            iVar1 = iniparser_getint(ini,"rgb enhance:coe",0);
            (cfg.rgb_enh)->coe = (float)iVar1;
            IVar4 = iniparser_getint(ini,"rgb enhance:mode",0);
            (cfg.rgb_enh)->mode = IVar4;
            iVar1 = iniparser_getint(ini,"rgb enhance:cg_en",0);
            (cfg.rgb_enh)->cg_en = (RK_U8)iVar1;
            iVar1 = iniparser_getint(ini,"rgb enhance:cg_rr",0);
            (cfg.rgb_enh)->cg_rr = (double)iVar1;
            iVar1 = iniparser_getint(ini,"rgb enhance:cg_rg",0);
            (cfg.rgb_enh)->cg_rg = (double)iVar1;
            iVar1 = iniparser_getint(ini,"rgb enhance:cg_rb",0);
            (cfg.rgb_enh)->cg_rb = (double)iVar1;
            IVar5 = iniparser_getint(ini,"rgb enhance:order",0);
            (cfg.rgb_enh)->order = IVar5;
            iVar1 = iniparser_getint(ini,"rgb enhance:threshold",0);
            (cfg.rgb_enh)->threshold = iVar1;
            iVar1 = iniparser_getint(ini,"rgb enhance:alpha_num",0);
            (cfg.rgb_enh)->alpha_num = iVar1;
            iVar1 = iniparser_getint(ini,"rgb enhance:alpha_base",0);
            (cfg.rgb_enh)->alpha_base = iVar1;
            iVar1 = iniparser_getint(ini,"rgb enhance:radius",0);
            (cfg.rgb_enh)->radius = iVar1;
          }
          iVar1 = iniparser_find_entry(ini,"colorcvt");
          if (iVar1 != 0) {
            cfg.colorcvt = (IepCmdParamColorConvert *)mpp_osal_calloc("parse_cfg",0x10);
            IVar6 = iniparser_getint(ini,"colorcvt:rgb2yuv_mode",0);
            (cfg.colorcvt)->rgb2yuv_mode = IVar6;
            IVar6 = iniparser_getint(ini,"colorcvt:yuv2rgb_mode",0);
            (cfg.colorcvt)->yuv2rgb_mode = IVar6;
            iVar1 = iniparser_getint(ini,"colorcvt:rgb2yuv_input_clip",0);
            (cfg.colorcvt)->rgb2yuv_input_clip = (RK_U8)iVar1;
            iVar1 = iniparser_getint(ini,"colorcvt:yuv2rgb_input_clip",0);
            (cfg.colorcvt)->yuv2rgb_input_clip = (RK_U8)iVar1;
            iVar1 = iniparser_getint(ini,"colorcvt:global_alpha_value",0);
            (cfg.colorcvt)->global_alpha_value = (RK_U8)iVar1;
            iVar1 = iniparser_getint(ini,"colorcvt:dither_up_en",0);
            (cfg.colorcvt)->dither_up_en = (RK_U8)iVar1;
            iVar1 = iniparser_getint(ini,"colorcvt:dither_down_en",0);
            (cfg.colorcvt)->dither_down_en = (RK_U8)iVar1;
          }
        }
      }
    } while (iVar1 != -1);
    iVar1 = 0;
    if (cfg.src_w < 1) {
      _mpp_log_l(2,"iep_test","non-positive input width %d\n",0);
      iVar1 = -1;
    }
    if (cfg.src_h < 1) {
      _mpp_log_l(2,"iep_test","non-positive input height %d\n",0);
      iVar1 = -1;
    }
    if (0x17 < (uint)cfg.src_fmt) {
      _mpp_log_l(2,"iep_test","invalid input format\n",0);
      iVar1 = -1;
    }
    if (cfg.fp_src == (FILE *)0x0) {
      _mpp_log_l(2,"iep_test","failed to open input file %s\n",0,cfg.src_url);
      iVar1 = -1;
    }
    if (cfg.dst_w < 1) {
      _mpp_log_l(2,"iep_test","non-positive input width %d\n",0);
      iVar1 = -1;
    }
    if (cfg.dst_h < 1) {
      _mpp_log_l(2,"iep_test","non-positive input height %d\n",0);
      iVar1 = -1;
    }
    if ((uint)cfg.dst_fmt < 0x18) {
      if (cfg.mode != TEST_CASE_NONE) {
        if (iVar1 != 0) goto LAB_00104335;
        info.cfg = &cfg;
        RVar7 = get_image_size(cfg.src_w,cfg.src_h,cfg.src_fmt);
        info.src_size = (long)RVar7;
        RVar8 = get_image_size(cfg.dst_w,cfg.dst_h,cfg.dst_fmt);
        info.dst_size = (size_t)RVar8;
        buffer = (MppBuffer)0x0;
        uVar11 = (long)RVar7 + 0xfff;
        uVar12 = uVar11 & 0xfffffffffffff000;
        uVar10 = info.dst_size + 0xfff & 0xfffffffffffff000;
        __n = (uVar10 + uVar12) * 2;
        mpp_buffer_get_with_tag(0,&buffer,__n,"iep_test","main");
        if ((buffer == (MppBuffer)0x0) &&
           (_mpp_log_l(2,"iep_test","Assertion %s failed at %s:%d\n",0,"buffer","main",0x212),
           (DAT_0010d1a3 & 0x10) != 0)) {
LAB_0010436b:
          abort();
        }
        RVar9 = mpp_buffer_get_fd_with_caller(buffer,"main");
        __s = (RK_U8 *)mpp_buffer_get_ptr_with_caller(buffer,"main");
        memset(__s,0xff,__n);
        info.phy_src1 = ((uint)uVar11 & 0xfffff000) * 0x400 + RVar9;
        iVar1 = (int)(uVar12 * 2);
        info.phy_dst0 = iVar1 * 0x400 + RVar9;
        info.phy_dst1 = ((int)uVar10 + iVar1) * 0x400 + RVar9;
        info.vir_src1 = __s + uVar12;
        info.vir_dst0 = __s + uVar12 * 2;
        info.vir_dst1 = info.vir_dst0 + uVar10;
        info.phy_src0 = RVar9;
        info.vir_src0 = __s;
        iep_init(&info.ctx);
        pthread_create(&td,(pthread_attr_t *)0x0,iep_process_thread,&info);
        pthread_join(td,(void **)0x0);
        if (info.ctx != (IepCtx)0x0) {
          iep_deinit();
          info.ctx = (IepCtx)0x0;
        }
        if (cfg.fp_src != (FILE *)0x0) {
          fclose((FILE *)cfg.fp_src);
          cfg.fp_src = (FILE *)0x0;
        }
        if (cfg.fp_dst != (FILE *)0x0) {
          fclose((FILE *)cfg.fp_dst);
          cfg.fp_dst = (FILE *)0x0;
        }
        if (cfg.ini != (dictionary *)0x0) {
          iniparser_freedict(cfg.ini);
          cfg.ini = (dictionary *)0x0;
          if (cfg.yuv_enh != (IepCmdParamYuvEnhance *)0x0) {
            mpp_osal_free("main");
          }
          if (cfg.rgb_enh != (IepCmdParamRgbEnhance *)0x0) {
            mpp_osal_free("main");
          }
          if (cfg.dei_cfg != (IepCmdParamDeiCfg *)0x0) {
            mpp_osal_free("main");
          }
          if (cfg.colorcvt != (IepCmdParamColorConvert *)0x0) {
            mpp_osal_free("main");
          }
        }
        mpp_buffer_put_with_caller(buffer,"main");
        goto LAB_001037bf;
      }
LAB_0010431b:
      _mpp_log_l(2,"iep_test","invalid work mode\n",0);
    }
    else {
      _mpp_log_l(2,"iep_test","invalid input format\n",0);
      if (cfg.mode == TEST_CASE_NONE) goto LAB_0010431b;
    }
LAB_00104335:
    iVar1 = -1;
    _mpp_log_l(2,"iep_test","failed to pass cmd line check\n",0);
    iep_test_help();
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    IepTestCfg cfg;
    IepTestInfo info;
    int ch;

    if (argc < 2) {
        iep_test_help();
        return 0;
    }

    memset(&cfg, 0, sizeof(cfg));
    memset(&info, 0, sizeof(info));
    cfg.src_fmt = IEP_FORMAT_YCbCr_420_SP;
    cfg.dst_fmt = IEP_FORMAT_YCbCr_420_SP;

    /// get options
    opterr = 0;
    while ((ch = getopt(argc, argv, "f:w:h:c:F:W:H:C:m:x:")) != -1) {
        switch (ch) {
        case 'w': {
            cfg.src_w = atoi(optarg);
        } break;
        case 'h': {
            cfg.src_h = atoi(optarg);
        } break;
        case 'c': {
            cfg.src_fmt = str_to_iep_fmt(optarg);
        } break;
        case 'W': {
            cfg.dst_w = atoi(optarg);
        } break;
        case 'H': {
            cfg.dst_h = atoi(optarg);
        } break;
        case 'C': {
            cfg.dst_fmt = str_to_iep_fmt(optarg);
        } break;
        case 'f': {
            mpp_log("input filename: %s\n", optarg);
            strncpy(cfg.src_url, optarg, sizeof(cfg.src_url) - 1);
            cfg.fp_src = fopen(cfg.src_url, "rb");
        } break;
        case 'F': {
            mpp_log("output filename: %s\n", optarg);
            strncpy(cfg.dst_url, optarg, sizeof(cfg.dst_url) - 1);
            cfg.fp_dst = fopen(cfg.dst_url, "w+b");
        } break;
        case 'm': {
            if (!strcmp(optarg, "deinterlace")) {
                cfg.mode = TEST_CASE_DEINTERLACE;
            } else if (!strcmp(optarg, "yuvenhance")) {
                cfg.mode = TEST_CASE_YUVENHANCE;
            } else if (!strcmp(optarg, "rgbenhance")) {
                cfg.mode = TEST_CASE_RGBENHANCE;
            } else {
                mpp_err("invalid work mode %s\n", optarg);
                cfg.mode = TEST_CASE_NONE;
            }
        } break;
        case 'x': {
            mpp_log("configure filename: %s\n", optarg);
            strncpy(cfg.cfg_url, optarg, sizeof(cfg.cfg_url) - 1);
            cfg.ini = iniparser_load(cfg.cfg_url);
            if (cfg.ini)
                parse_cfg(&cfg);
            else
                mpp_err("invalid configure file %s\n", optarg);
        } break;
        default: {
        } break;
        }
    }

    if (check_input_cmd(&cfg)) {
        mpp_err("failed to pass cmd line check\n");
        iep_test_help();
        return -1;
    }

    info.cfg = &cfg;
    info.src_size = get_image_size(cfg.src_w, cfg.src_h, cfg.src_fmt);
    info.dst_size = get_image_size(cfg.dst_w, cfg.dst_h, cfg.dst_fmt);

    // allocate 12M in/out memory and initialize memory address
    MppBuffer buffer = NULL;
    size_t src_size = MPP_ALIGN(info.src_size, SZ_4K);
    size_t dst_size = MPP_ALIGN(info.dst_size, SZ_4K);
    // NOTE: deinterlace need 4 fields (2 frames) as input and output 2 frames
    size_t total_size = src_size * 2 + dst_size * 2;

    mpp_buffer_get(NULL, &buffer, total_size);
    mpp_assert(buffer);

    int buf_fd = mpp_buffer_get_fd(buffer);
    RK_U8 *buf_ptr = (RK_U8 *)mpp_buffer_get_ptr(buffer);

    memset(buf_ptr, 0xff, total_size);

    info.phy_src0 = ADD_OFFSET(buf_fd, 0);
    info.phy_src1 = ADD_OFFSET(buf_fd, src_size);
    info.phy_dst0 = ADD_OFFSET(buf_fd, src_size * 2);
    info.phy_dst1 = ADD_OFFSET(buf_fd, src_size * 2 + dst_size);

    info.vir_src0 = buf_ptr;
    info.vir_src1 = buf_ptr + src_size;
    info.vir_dst0 = buf_ptr + src_size * 2;
    info.vir_dst1 = buf_ptr + src_size * 2 + dst_size;

    iep_init(&info.ctx);

    pthread_t td;
    pthread_create(&td, NULL, iep_process_thread, &info);
    pthread_join(td, NULL);

    if (info.ctx) {
        iep_deinit(info.ctx);
        info.ctx = NULL;
    }

    if (cfg.fp_src) {
        fclose(cfg.fp_src);
        cfg.fp_src = NULL;
    }

    if (cfg.fp_dst) {
        fclose(cfg.fp_dst);
        cfg.fp_dst = NULL;
    }

    if (cfg.ini) {
        iniparser_freedict(cfg.ini);
        cfg.ini = NULL;
        if (cfg.yuv_enh)
            mpp_free(cfg.yuv_enh);
        if (cfg.rgb_enh)
            mpp_free(cfg.rgb_enh);
        if (cfg.dei_cfg)
            mpp_free(cfg.dei_cfg);
        if (cfg.colorcvt)
            mpp_free(cfg.colorcvt);
    }

    mpp_buffer_put(buffer);

    return 0;
}